

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>::
Holder(Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry> *this)

{
  long in_FS_OFFSET;
  InterfaceType *local_38;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QReadWriteLock::QReadWriteLock
            (&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
              ::instance::holder.storage.lock,NonRecursive);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  ::instance::holder.storage.registry.d.size = 0;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  ::instance::holder.storage.aliases.d =
       (QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>)(Data *)0x0;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  ::instance::holder.storage.registry.d.d = (Data *)0x0;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  ::instance::holder.storage.registry.d.ptr = (QMetaTypeInterface **)0x0;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  ::instance::holder.storage.firstEmpty = 0;
  QByteArray::QByteArray(&local_30,"qfloat16",-1);
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<qfloat16>::metaType;
  QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*>::
  emplace<QtPrivate::QMetaTypeInterface_const*const&>
            ((QHash<QByteArray,QtPrivate::QMetaTypeInterface_const*> *)
             &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
              ::instance::holder.storage.aliases,&local_30,&local_38);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
    }
  }
  guard._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }